

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilFile.c
# Opt level: O2

char * vnsprintf(char *format,__va_list_tag *args)

{
  uint uVar1;
  char *__s;
  va_list args_copy;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  if (vnsprintf::dummy_file == (FILE *)0x0) {
    vnsprintf::dummy_file = (FILE *)fopen("/dev/null","wb");
  }
  local_28 = args->reg_save_area;
  local_38._0_4_ = args->gp_offset;
  local_38._4_4_ = args->fp_offset;
  pvStack_30 = args->overflow_arg_area;
  uVar1 = vfprintf((FILE *)vnsprintf::dummy_file,format,args);
  __s = (char *)malloc((ulong)(uVar1 + 1));
  __s[uVar1] = -1;
  vsprintf(__s,format,&local_38);
  if (__s[uVar1] == '\0') {
    return __s;
  }
  __assert_fail("ret[n] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilFile.c"
                ,0xc9,"char *vnsprintf(const char *, struct __va_list_tag *)");
}

Assistant:

char* vnsprintf(const char* format, va_list args)
{
    unsigned n;
    char*    ret;
    va_list  args_copy;

    static FILE* dummy_file = NULL;
    if (!dummy_file)
    {
#if !defined(_MSC_VER) && !defined(__MINGW32)
        dummy_file = fopen("/dev/null", "wb");
#else
        dummy_file = fopen("NUL", "wb");
#endif
    }

#if defined(__va_copy)
    __va_copy(args_copy, args);
#else
  #if defined(va_copy)
    va_copy(args_copy, args);
  #else
    args_copy = args;
  #endif
#endif
    n = vfprintf(dummy_file, format, args);
    ret = ABC_ALLOC( char, n + 1 );
    ret[n] = (char)255;
    args = args_copy;
    vsprintf(ret, format, args);
#if !defined(__va_copy) && defined(va_copy)
    va_end(args_copy);
#endif
    assert(ret[n] == 0);
    return ret;
}